

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
                   (GeneratorOptions *options,FileDescriptor *from_file,Descriptor *desc)

{
  bool bVar1;
  Descriptor *in_RCX;
  string *in_RDI;
  Descriptor *in_stack_00000028;
  FileDescriptor *in_stack_00000030;
  GeneratorOptions *in_stack_00000038;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator *paVar2;
  string *__lhs;
  string local_58 [55];
  allocator local_21 [33];
  
  __lhs = in_RDI;
  Descriptor::full_name_abi_cxx11_(in_RCX);
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    paVar2 = local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__lhs,"jspb.Message.messageSetExtensions",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_21);
  }
  else {
    MaybeCrossFileRef_abi_cxx11_(in_stack_00000038,in_stack_00000030,in_stack_00000028);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

std::string JSExtensionsObjectName(const GeneratorOptions& options,
                                   const FileDescriptor* from_file,
                                   const Descriptor* desc) {
  if (desc->full_name() == "google.protobuf.bridge.MessageSet") {
    // TODO(haberman): fix this for the kImportCommonJs case.
    return "jspb.Message.messageSetExtensions";
  } else {
    return MaybeCrossFileRef(options, from_file, desc) + ".extensions";
  }
}